

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mimeenc.c
# Opt level: O2

int charset_from_mimeenc(char *name)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  __int32_t **pp_Var4;
  long lVar5;
  long lVar6;
  
  lVar6 = 0;
  do {
    lVar5 = lVar6;
    if (lVar5 == 0x82) {
      return 0;
    }
    pcVar3 = mimeencs[lVar5].name;
    lVar6 = 0;
    while( true ) {
      bVar1 = name[lVar6];
      bVar2 = pcVar3[lVar6];
      if (bVar1 == 0 && bVar2 == 0) goto LAB_00113ce4;
      pp_Var4 = __ctype_tolower_loc();
      if ((*pp_Var4)[bVar1] != (*pp_Var4)[bVar2]) break;
      lVar6 = lVar6 + 1;
    }
    lVar6 = lVar5 + 1;
  } while (bVar2 != 0 || bVar1 != 0);
LAB_00113ce4:
  return mimeencs[lVar5].charset;
}

Assistant:

int charset_from_mimeenc(const char *name)
{
    int i;

    for (i = 0; i < (int)lenof(mimeencs); i++) {
        const char *p, *q;
        p = name;
        q = mimeencs[i].name;
        while (*p || *q) {
                if (tolower((unsigned char)*p) != tolower((unsigned char)*q))
                break;
            p++; q++;
        }
        if (!*p && !*q)
            return mimeencs[i].charset;
    }

    return CS_NONE;                    /* not found */
}